

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

char * parasail_pack_fastq_buffer(char *T,off_t size,long *packed_size)

{
  char cVar1;
  parasail_file_stat_t *__ptr;
  char *__ptr_00;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  
  if (T == (char *)0x0) {
    parasail_pack_fastq_buffer_cold_5();
  }
  else if (packed_size == (long *)0x0) {
    parasail_pack_fastq_buffer_cold_4();
  }
  else {
    __ptr = parasail_stat_fastq_buffer(T,size);
    if (__ptr == (parasail_file_stat_t *)0x0) {
      parasail_pack_fastq_buffer_cold_3();
    }
    else {
      __ptr_00 = (char *)malloc(__ptr->characters + __ptr->sequences + 1);
      if (__ptr_00 != (char *)0x0) {
        free(__ptr);
        if (size < 1) {
          lVar2 = 0;
        }
        else {
          lVar4 = 0;
          lVar2 = 0;
          lVar3 = 0;
          bVar5 = false;
          do {
            if (T[lVar3] != '@') {
              fprintf(_stderr,"parasail_pack_fastq_buffer: poorly formatted FASTQ file, line %lu\n",
                      lVar4);
              free(__ptr_00);
              return (char *)0x0;
            }
            if (bVar5) {
              __ptr_00[lVar2] = '$';
              lVar2 = lVar2 + 1;
            }
            for (; (T[lVar3] != '\n' && (T[lVar3] != '\r')); lVar3 = lVar3 + 1) {
            }
            lVar6 = lVar3 + 1;
            if ((T[lVar3 + 1] != '\n') && (T[lVar3 + 1] != '\r')) {
              lVar6 = lVar3;
            }
            for (lVar6 = lVar6 + 2; (cVar1 = T[lVar6 + -1], cVar1 != '\n' && (cVar1 != '\r'));
                lVar6 = lVar6 + 1) {
              __ptr_00[lVar2] = cVar1;
              lVar2 = lVar2 + 1;
            }
            if ((size <= lVar6) || ((T[lVar6] != '\n' && (T[lVar6] != '\r')))) {
              lVar6 = lVar6 + -1;
            }
            if (T[lVar6 + 1] != '+') {
              parasail_pack_fastq_buffer_cold_1();
              return (char *)0x0;
            }
            for (lVar6 = lVar6 + 2; (T[lVar6 + -1] != '\n' && (T[lVar6 + -1] != '\r'));
                lVar6 = lVar6 + 1) {
            }
            if ((T[lVar6] != '\n') && (T[lVar6] != '\r')) {
              lVar6 = lVar6 + -1;
            }
            lVar3 = lVar6 + 1;
            do {
              lVar6 = lVar3;
              lVar3 = lVar6 + 1;
              if (T[lVar6] == '\r') break;
            } while (T[lVar6] != '\n');
            if ((T[lVar3] != '\n') && (T[lVar3] != '\r')) {
              lVar3 = lVar6;
            }
            lVar3 = lVar3 + 1;
            lVar4 = lVar4 + 4;
            bVar5 = true;
          } while (lVar3 < size);
        }
        (__ptr_00 + lVar2)[0] = '$';
        (__ptr_00 + lVar2)[1] = '\0';
        *packed_size = lVar2 + 1;
        return __ptr_00;
      }
      parasail_pack_fastq_buffer_cold_2();
    }
  }
  return (char *)0x0;
}

Assistant:

char * parasail_pack_fastq_buffer(const char *T, off_t size, long * packed_size)
{
    char *P = NULL;
    int first = 1;
    off_t i = 0;
    off_t w = 0;
    unsigned long line = 0;
    parasail_file_stat_t *pfs = NULL;

    if (NULL == T) {
        fprintf(stderr, "parasail_pack_fastq_buffer: NULL pointer\n");
        return NULL;
    }

    if (NULL == packed_size) {
        fprintf(stderr, "parasail_pack_fastq_buffer: NULL size pointer\n");
        return NULL;
    }

    pfs = parasail_stat_fastq_buffer(T, size);
    if (NULL == pfs) {
        fprintf(stderr, "parasail_stat_fastq_buffer: fastq stat failed\n");
        return NULL;
    }

    P = (char*)malloc(sizeof(char) * (pfs->characters+pfs->sequences+1));
    if (NULL == P) {
        perror("malloc");
        fprintf(stderr, "parasail_pack_fastq_buffer: malloc failed\n");
        free(pfs);
        return NULL;
    }
    free(pfs);

    /* read file */
    while (i<size) {
        if (T[i] != '@') {
            fprintf(stderr, "parasail_pack_fastq_buffer: "
                    "poorly formatted FASTQ file, line %lu\n", line);
            free(P);
            return NULL;
        }

        /* encountered a new sequence */
        if (first) {
            first = 0;
        }
        else {
            P[w++] = '$';
        }

        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;

        /* rest of next line is the sequence */
        while (T[i] != '\n' && T[i] != '\r') {
            P[w++] = T[i];
            ++i;
        }

        /* for the case of "\r\n" or "\n\r" */
        if (i+1<size && (T[i+1] == '\n' || T[i+1] == '\r')) {
            ++i;
        }

        /* go to next line */
        ++i;
        ++line;

        if (T[i] != '+') {
            fprintf(stderr, "parasail_pack_fastq_buffer: "
                    "poorly formatted FASTQ file, line %lu\n", line);
            free(P);
            return NULL;
        }

        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;

        /* rest of next line are the quality control values */
        i = skip_line(T, i);

        /* go to next line */
        ++i;
        ++line;
    }

    P[w++] = '$';
    P[w] = '\0';
    *packed_size = w;
    return P;
}